

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void Test_CheckNOTNULL_Simple::RunTest(void)

{
  void **ppvVar1;
  long *local_28;
  void *ptr;
  int64 t;
  
  ptr = &t;
  ppvVar1 = google::CheckNotNull<void*&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                       ,0x260,"\'ptr\' Must be non NULL",&ptr);
  if (ptr == *ppvVar1) {
    local_28 = (long *)ptr;
    google::CheckNotNull<char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x262,"\'reinterpret_cast<char *>(ptr)\' Must be non NULL",(char **)&local_28);
    local_28 = (long *)ptr;
    google::CheckNotNull<unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x263,"\'reinterpret_cast<unsigned char *>(ptr)\' Must be non NULL",
               (uchar **)&local_28);
    local_28 = (long *)ptr;
    google::CheckNotNull<int*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x264,"\'reinterpret_cast<int *>(ptr)\' Must be non NULL",(int **)&local_28);
    local_28 = (long *)ptr;
    google::CheckNotNull<long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x265,"\'reinterpret_cast<int64 *>(ptr)\' Must be non NULL",&local_28);
    return;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","ptr","==","ref");
  exit(1);
}

Assistant:

TEST(CheckNOTNULL, Simple) {
  int64 t;
  void *ptr = static_cast<void *>(&t);
  void *ref = CHECK_NOTNULL(ptr);
  EXPECT_EQ(ptr, ref);
  CHECK_NOTNULL(reinterpret_cast<char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<unsigned char *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int *>(ptr));
  CHECK_NOTNULL(reinterpret_cast<int64 *>(ptr));
}